

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O0

void test_bson_visit_unsupported_type(void)

{
  byte bVar1;
  int iVar2;
  bson_visitor_t visitor;
  unsupported_type_test_data_t context;
  bson_iter_t iter;
  bson_t b;
  char data [13];
  undefined1 local_318 [184];
  code *local_260;
  byte local_218 [8];
  char *local_210;
  int local_208;
  undefined1 local_200 [128];
  undefined1 local_180 [227];
  undefined8 local_9d;
  undefined4 local_95;
  undefined1 local_91;
  
  local_9d = 0x1006b330000000c;
  local_95 = 0;
  local_91 = 0;
  memset(local_218,0,0x18);
  memset(local_318,0,0x100);
  local_260 = visit_unsupported_type;
  bVar1 = bson_init_static(local_180,&local_9d,0xc);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x85f,"test_bson_visit_unsupported_type",
            "bson_init_static (&b, (const uint8_t *) data, sizeof data - 1)");
    abort();
  }
  bVar1 = bson_iter_init(local_200,local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x860,"test_bson_visit_unsupported_type","bson_iter_init (&iter, &b)");
    abort();
  }
  bson_iter_visit_all(local_200,local_318,local_218);
  bVar1 = bson_iter_next(local_200);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x862,"test_bson_visit_unsupported_type","!bson_iter_next (&iter)");
    abort();
  }
  if ((local_218[0] & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x863,"test_bson_visit_unsupported_type","context.visited");
    abort();
  }
  iVar2 = strcmp(local_210,"k");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x864,"test_bson_visit_unsupported_type","!strcmp (context.key, \"k\")");
    abort();
  }
  if (local_208 != 0x33) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x865,"test_bson_visit_unsupported_type","context.type_code == \'\\x33\'");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_visit_unsupported_type (void)
{
   /* {k: 1}, but instead of BSON type 0x10 (int32), use unknown type 0x33 */
   const char data[] = "\x0c\x00\x00\x00\x33k\x00\x01\x00\x00\x00\x00";
   bson_t b;
   bson_iter_t iter;
   unsupported_type_test_data_t context = {0};
   bson_visitor_t visitor = {0};

   visitor.visit_unsupported_type = visit_unsupported_type;

   BSON_ASSERT (bson_init_static (&b, (const uint8_t *) data, sizeof data - 1));
   BSON_ASSERT (bson_iter_init (&iter, &b));
   bson_iter_visit_all (&iter, &visitor, (void *) &context);
   BSON_ASSERT (!bson_iter_next (&iter));
   BSON_ASSERT (context.visited);
   BSON_ASSERT (!strcmp (context.key, "k"));
   BSON_ASSERT (context.type_code == '\x33');
}